

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

double feintrack::calc_center_mass(hist_cont *arr,double *area)

{
  size_type sVar1;
  const_reference pvVar2;
  undefined1 auVar3 [16];
  undefined8 local_28;
  size_t i;
  double sum2;
  double *area_local;
  hist_cont *arr_local;
  
  i = 0;
  *area = 0.0;
  local_28 = 0;
  while( true ) {
    sVar1 = std::vector<double,_std::allocator<double>_>::size(arr);
    if (sVar1 <= local_28) break;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](arr,local_28);
    *area = *area + *pvVar2;
    auVar3._8_4_ = (int)(local_28 >> 0x20);
    auVar3._0_8_ = local_28;
    auVar3._12_4_ = 0x45300000;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](arr,local_28);
    i = (size_t)(((auVar3._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)local_28) - 4503599627370496.0)) * *pvVar2 +
                (double)i);
    local_28 = local_28 + 1;
  }
  return (double)i / *area;
}

Assistant:

double calc_center_mass(const hist_cont& arr, double& area)
	{
		double sum2(0.);
		area = 0.;
		for (size_t i = 0; i < arr.size(); ++i)
		{
			area += arr[i];
			sum2 += i * arr[i];
		}
		return sum2 /= area;
	}